

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

word * Gia_ObjComputeTruthTable(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  ulong *puVar3;
  ulong *puVar4;
  undefined4 uVar5;
  void *pvVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  undefined8 uVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  void **ppvVar12;
  Vec_Ptr_t *pVVar13;
  Vec_Wrd_t *pVVar14;
  word *pwVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  word Fill;
  ulong uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  word *pwVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  word *pwVar27;
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    uVar22 = p->vCis->nSize - p->nRegs;
    p->nTtVars = uVar22;
    iVar21 = 1 << ((char)uVar22 - 6U & 0x1f);
    if ((int)uVar22 < 7) {
      iVar21 = 1;
    }
    p->nTtWords = iVar21;
    iVar21 = p->nObjs;
    lVar17 = (long)iVar21 + 1000;
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    iVar25 = (int)lVar17;
    iVar20 = 0x10;
    if (0xe < iVar21 + 999U) {
      iVar20 = iVar25;
    }
    pVVar10->nSize = 0;
    pVVar10->nCap = iVar20;
    if (iVar20 == 0) {
      piVar11 = (int *)0x0;
    }
    else {
      piVar11 = (int *)malloc((long)iVar20 << 2);
    }
    pVVar10->pArray = piVar11;
    pVVar10->nSize = iVar25;
    uVar19 = 0;
    memset(piVar11,0,lVar17 * 4);
    p->vTtNums = pVVar10;
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    pVVar10->nCap = 0x100;
    pVVar10->nSize = 0;
    piVar11 = (int *)malloc(0x400);
    pVVar10->pArray = piVar11;
    p->vTtNodes = pVVar10;
    uVar16 = 6;
    if (6 < (int)uVar22) {
      uVar16 = (ulong)uVar22;
    }
    iVar21 = (int)uVar16;
    iVar20 = iVar21 + -5;
    uVar22 = 1 << ((byte)iVar20 & 0x1f);
    ppvVar12 = (void **)malloc(((long)(int)uVar22 * 4 + 8) * uVar16);
    lVar17 = uVar16 * 8;
    do {
      ppvVar12[uVar19] = (void *)((long)ppvVar12 + lVar17);
      uVar19 = uVar19 + 1;
      lVar17 = lVar17 + (long)(int)uVar22 * 4;
    } while (uVar16 != uVar19);
    pVVar13 = (Vec_Ptr_t *)malloc(0x10);
    pVVar13->nSize = iVar21;
    pVVar13->nCap = iVar21;
    pVVar13->pArray = ppvVar12;
    uVar19 = 0;
    do {
      pvVar6 = ppvVar12[uVar19];
      if (uVar19 < 5) {
        if (iVar20 != 0x1f) {
          uVar5 = (&DAT_00991cd0)[uVar19];
          uVar26 = 0;
          do {
            *(undefined4 *)((long)pvVar6 + uVar26 * 4) = uVar5;
            uVar26 = uVar26 + 1;
          } while (uVar22 != uVar26);
        }
      }
      else if (iVar20 != 0x1f) {
        uVar26 = 0;
        do {
          *(uint *)((long)pvVar6 + uVar26 * 4) =
               -(uint)((1 << ((char)uVar19 - 5U & 0x1f) & (uint)uVar26) != 0);
          uVar26 = uVar26 + 1;
        } while (uVar22 != uVar26);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar16);
    p->vTtInputs = pVVar13;
    lVar17 = (long)p->nTtWords;
    pVVar14 = (Vec_Wrd_t *)malloc(0x10);
    pVVar14->nSize = 0;
    iVar21 = (int)(lVar17 << 8);
    pVVar14->nCap = iVar21;
    if (lVar17 == 0) {
      pwVar15 = (word *)0x0;
    }
    else {
      pwVar15 = (word *)malloc(lVar17 << 0xb);
    }
    pVVar14->pArray = pwVar15;
    pVVar14->nSize = iVar21;
    memset(pwVar15,0,(long)iVar21 << 3);
    p->vTtMemory = pVVar14;
  }
  else if (p->nTtVars != p->vCis->nSize - p->nRegs) {
    __assert_fail("p->nTtVars == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                  ,0xf1,"word *Gia_ObjComputeTruthTable(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->vTtNums->nSize < p->nObjs) {
    Vec_IntFillExtra(p->vTtNums,p->nObjs,0);
  }
  uVar16 = *(ulong *)pObj & 0x1fffffff;
  uVar19 = 0;
  if (uVar16 != 0x1fffffff) {
    uVar19 = -uVar16;
  }
  pObj_00 = pObj + (uVar19 & (long)(int)*(ulong *)pObj >> 0x1f);
  p->vTtNodes->nSize = 0;
  Gia_ObjCollectInternal_rec(p,pObj_00);
  iVar21 = (p->vTtNodes->nSize + 2) * p->nTtWords;
  if (p->vTtMemory->nSize < iVar21) {
    Vec_WrdFillExtra(p->vTtMemory,iVar21,Fill);
  }
  pVVar10 = p->vTtNodes;
  if (0 < pVVar10->nSize) {
    lVar17 = 0;
    while( true ) {
      iVar21 = pVVar10->pArray[lVar17];
      if (((long)iVar21 < 0) || (p->nObjs <= iVar21)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar8 = p->pObjs + iVar21;
      uVar19 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar19 & 0xffffffffbfffffff;
      pGVar7 = p->pObjs;
      if ((pGVar8 < pGVar7) || (pGVar1 = pGVar7 + p->nObjs, pGVar1 <= pGVar8)) goto LAB_00781869;
      uVar22 = (int)((long)pGVar8 - (long)pGVar7 >> 2) * -0x55555555;
      if ((int)uVar22 < 0) goto LAB_00781888;
      iVar21 = p->vTtNums->nSize;
      if (iVar21 <= (int)uVar22) goto LAB_00781888;
      pwVar15 = p->vTtMemory->pArray;
      iVar20 = p->nTtWords;
      lVar24 = (long)iVar20;
      piVar11 = p->vTtNums->pArray;
      iVar25 = piVar11[uVar22 & 0x7fffffff] * iVar20;
      uVar16 = (ulong)((uint)uVar19 & 0x1fffffff);
      uVar22 = (uint)*(undefined8 *)(pGVar8 + -uVar16);
      if ((~uVar22 & 0x1fffffff) == 0 || (int)uVar22 < 0) {
        if (-1 < (int)uVar22) goto LAB_007818e5;
        uVar22 = (uint)((ulong)*(undefined8 *)(pGVar8 + -uVar16) >> 0x20);
        if (p->vTtInputs->nSize <= (int)(uVar22 & 0x1fffffff)) goto LAB_007818c6;
        pwVar23 = *(word **)((long)p->vTtInputs->pArray + (ulong)(uVar22 << 3));
      }
      else {
        pGVar2 = pGVar8 + -uVar16;
        if ((pGVar2 < pGVar7) || (pGVar1 <= pGVar2)) goto LAB_00781869;
        uVar22 = (int)((long)pGVar2 - (long)pGVar7 >> 2) * -0x55555555;
        if (((int)uVar22 < 0) || (iVar21 <= (int)uVar22)) goto LAB_00781888;
        pwVar23 = pwVar15 + piVar11[uVar22 & 0x7fffffff] * lVar24;
      }
      uVar16 = (ulong)((uint)(uVar19 >> 0x20) & 0x1fffffff);
      uVar22 = (uint)*(undefined8 *)(pGVar8 + -uVar16);
      if ((~uVar22 & 0x1fffffff) == 0 || (int)uVar22 < 0) {
        if (-1 < (int)uVar22) {
LAB_007818e5:
          __assert_fail("pObj->fTerm",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
        }
        uVar22 = (uint)((ulong)*(undefined8 *)(pGVar8 + -uVar16) >> 0x20);
        if (p->vTtInputs->nSize <= (int)(uVar22 & 0x1fffffff)) goto LAB_007818c6;
        pwVar27 = *(word **)((long)p->vTtInputs->pArray + (ulong)(uVar22 << 3));
      }
      else {
        pGVar8 = pGVar8 + -uVar16;
        if ((pGVar8 < pGVar7) || (pGVar1 <= pGVar8)) goto LAB_00781869;
        uVar22 = (int)((long)pGVar8 - (long)pGVar7 >> 2) * -0x55555555;
        if (((int)uVar22 < 0) || (iVar21 <= (int)uVar22)) goto LAB_00781888;
        pwVar27 = pwVar15 + piVar11[uVar22 & 0x7fffffff] * lVar24;
      }
      puVar3 = pwVar15 + iVar25 + lVar24;
      if (((uint)uVar19 >> 0x1d & 1) == 0) {
        if ((uVar19 >> 0x3d & 1) == 0) {
          if (0 < iVar20) {
            lVar24 = 0;
            do {
              puVar4 = (ulong *)((long)pwVar15 + lVar24 + (long)iVar25 * 8);
              *puVar4 = *(ulong *)((long)pwVar27 + lVar24) & *(ulong *)((long)pwVar23 + lVar24);
              lVar24 = lVar24 + 8;
            } while (puVar4 + 1 < puVar3);
          }
        }
        else if (0 < iVar20) {
          lVar24 = 0;
          do {
            puVar4 = (ulong *)((long)pwVar15 + lVar24 + (long)iVar25 * 8);
            *puVar4 = ~*(ulong *)((long)pwVar27 + lVar24) & *(ulong *)((long)pwVar23 + lVar24);
            lVar24 = lVar24 + 8;
          } while (puVar4 + 1 < puVar3);
        }
      }
      else if ((uVar19 >> 0x3d & 1) == 0) {
        if (0 < iVar20) {
          lVar24 = 0;
          do {
            puVar4 = (ulong *)((long)pwVar15 + lVar24 + (long)iVar25 * 8);
            *puVar4 = ~*(ulong *)((long)pwVar23 + lVar24) & *(ulong *)((long)pwVar27 + lVar24);
            lVar24 = lVar24 + 8;
          } while (puVar4 + 1 < puVar3);
        }
      }
      else if (0 < iVar20) {
        lVar24 = 0;
        do {
          puVar4 = (ulong *)((long)pwVar15 + lVar24 + (long)iVar25 * 8);
          *puVar4 = ~(*(ulong *)((long)pwVar27 + lVar24) | *(ulong *)((long)pwVar23 + lVar24));
          lVar24 = lVar24 + 8;
        } while (puVar4 + 1 < puVar3);
      }
      lVar17 = lVar17 + 1;
      pVVar10 = p->vTtNodes;
      if (pVVar10->nSize <= lVar17) break;
    }
  }
  uVar19 = *(ulong *)pObj_00;
  if ((~uVar19 & 0x1fffffff1fffffff) == 0) {
    lVar17 = (long)p->nTtWords;
    pwVar15 = p->vTtMemory->pArray + (p->vTtMemory->nSize - lVar17);
    if (0 < lVar17) {
      memset(pwVar15,0,lVar17 * 8);
    }
  }
  else {
    uVar22 = (uint)uVar19;
    if (((uVar22 & 0x9fffffff) == 0x9fffffff) &&
       (uVar18 = (uint)(uVar19 >> 0x20), (int)(uVar18 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
      if (p->vTtInputs->nSize <= (int)(uVar18 & 0x1fffffff)) {
LAB_007818c6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pwVar15 = *(word **)((long)p->vTtInputs->pArray + (ulong)(uVar18 << 3));
    }
    else if ((~uVar22 & 0x1fffffff) == 0 || (int)uVar22 < 0) {
      pwVar15 = (word *)0x0;
    }
    else {
      pGVar8 = p->pObjs;
      if ((pObj_00 < pGVar8) || (pGVar8 + p->nObjs <= pObj_00)) {
LAB_00781869:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar22 = (int)((long)pObj_00 - (long)pGVar8 >> 2) * -0x55555555;
      if (((int)uVar22 < 0) || (p->vTtNums->nSize <= (int)uVar22)) {
LAB_00781888:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pwVar15 = p->vTtMemory->pArray +
                (long)p->vTtNums->pArray[uVar22 & 0x7fffffff] * (long)p->nTtWords;
    }
  }
  iVar21 = p->nTtWords;
  pwVar23 = p->vTtMemory->pArray + ((long)p->vTtMemory->nSize - (long)(iVar21 * 2));
  if (0 < (long)iVar21) {
    uVar9 = *(undefined8 *)pObj;
    lVar17 = 0;
    do {
      pwVar23[lVar17] =
           pwVar15[lVar17] ^
           -(ulong)(((uint)uVar9 & 0xa0000000) == 0xa0000000 && (~(uint)uVar9 & 0x1fffffff) != 0);
      lVar17 = lVar17 + 1;
    } while (iVar21 != lVar17);
  }
  return pwVar23;
}

Assistant:

word * Gia_ObjComputeTruthTable( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pTemp, * pRoot;
    word * pTruth, * pTruthL, * pTruth0, * pTruth1;
    int i;
    if ( p->vTtMemory == NULL )
    {
        p->nTtVars   = Gia_ManPiNum( p );
        p->nTtWords  = Abc_Truth6WordNum( p->nTtVars );
        p->vTtNums   = Vec_IntStart( Gia_ManObjNum(p) + 1000 );
        p->vTtNodes  = Vec_IntAlloc( 256 );
        p->vTtInputs = Vec_PtrAllocTruthTables( Abc_MaxInt(6, p->nTtVars) );
        p->vTtMemory = Vec_WrdStart( p->nTtWords * 256 );
    }
    else
    {
        // make sure the number of primary inputs did not change 
        // since the truth table computation storage was prepared
        assert( p->nTtVars == Gia_ManPiNum(p) );
    }
    // extend ID numbers
    if ( Vec_IntSize(p->vTtNums) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( p->vTtNums, Gia_ManObjNum(p), 0 );
    // collect internal nodes
    pRoot = Gia_ObjIsCo(pObj) ? Gia_ObjFanin0(pObj) : pObj;
    Gia_ObjCollectInternal( p, pRoot );
    // extend TT storage
    if ( Vec_WrdSize(p->vTtMemory) < p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2) )
        Vec_WrdFillExtra( p->vTtMemory, p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2), 0 );
    // compute the truth table for internal nodes
    Gia_ManForEachObjVec( p->vTtNodes, p, pTemp, i )
    {
        pTemp->fMark0 = 0; // unmark nodes marked by Gia_ObjCollectInternal()
        pTruth  = Gla_ObjTruthNode(p, pTemp);
        pTruthL = pTruth + p->nTtWords;
        pTruth0 = Gia_ObjIsAnd(Gia_ObjFanin0(pTemp)) ? Gla_ObjTruthNode(p, Gia_ObjFanin0(pTemp)) : Gla_ObjTruthElem(p, Gia_ObjCioId(Gia_ObjFanin0(pTemp)) );
        pTruth1 = Gia_ObjIsAnd(Gia_ObjFanin1(pTemp)) ? Gla_ObjTruthNode(p, Gia_ObjFanin1(pTemp)) : Gla_ObjTruthElem(p, Gia_ObjCioId(Gia_ObjFanin1(pTemp)) );
        if ( Gia_ObjFaninC0(pTemp) )
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ &  *pTruth1++;
        }
        else
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ &  *pTruth1++;
        }
    }
    // compute the final table
    if ( Gia_ObjIsConst0(pRoot) )
        pTruth = Gla_ObjTruthConst0( p, Gla_ObjTruthFree1(p) );
    else if ( Gia_ObjIsPi(p, pRoot) )
        pTruth = Gla_ObjTruthElem( p, Gia_ObjCioId(pRoot) );
    else if ( Gia_ObjIsAnd(pRoot) )
        pTruth = Gla_ObjTruthNode( p, pRoot );
    else
        pTruth = NULL;
    return Gla_ObjTruthDup( p, Gla_ObjTruthFree2(p), pTruth, Gia_ObjIsCo(pObj) && Gia_ObjFaninC0(pObj) );
}